

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

void __thiscall VulkanHppGenerator::generateRAIIHppFile(VulkanHppGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string str;
  string vulkan_raii_hpp;
  allocator_type local_282;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  paVar1 = &local_260.field_2;
  local_260._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp","");
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_260,"/vulkan/");
  paVar2 = &local_280.field_2;
  local_280._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar6 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p == paVar6) {
    local_280.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_280.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_280._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_280.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_280._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_280,(this->m_api)._M_dataplus._M_p,(this->m_api)._M_string_length);
  paVar6 = &local_170.first.field_2;
  local_170.first._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.first._M_dataplus._M_p == paVar4) {
    local_170.first.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_170.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_170.first._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
    local_170.first.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_170.first._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_170.first,"_raii.hpp");
  local_240._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p == paVar4) {
    local_240.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_240.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  }
  else {
    local_240.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_240._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.first._M_dataplus._M_p != paVar6) {
    operator_delete(local_170.first._M_dataplus._M_p,
                    local_170.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar1) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_280,"VulkanHppGenerator: Generating ",&local_240);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_280," ...\n");
  local_170.first._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.first._M_dataplus._M_p == paVar4) {
    local_170.first.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_170.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_170.first._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
    local_170.first.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_170.first._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  SyncedMessageHandler::message(&messager,&local_170.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.first._M_dataplus._M_p != paVar6) {
    operator_delete(local_170.first._M_dataplus._M_p,
                    local_170.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"RAIIHppFileTemplate.hpp","")
  ;
  anon_unknown.dwarf_18c225::readSnippet(&local_260,&local_220);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_true>(&local_170,(char (*) [4])0x23fe69,&this->m_api);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_true>
            (&local_130,(char (*) [14])"licenseHeader",&this->m_vulkanLicenseHeader);
  generateRAIICommandDefinitions_abi_cxx11_(&local_1c0,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[23],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_f0,(char (*) [23])"RAIICommandDefinitions",&local_1c0);
  generateRAIIDispatchers_abi_cxx11_(&local_1e0,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_b0,(char (*) [16])"RAIIDispatchers",&local_1e0);
  generateRAIIHandles_abi_cxx11_(&local_200,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_70,(char (*) [12])"RAIIHandles",&local_200);
  __l._M_len = 5;
  __l._M_array = &local_170;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_1a0,__l,&local_281,&local_282);
  replaceWithMap(&local_280,&local_260,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1a0);
  lVar5 = -0x140;
  paVar6 = &local_70.second.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    if (&paVar6->_M_allocated_capacity + -4 != (size_type *)(&paVar6->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar6->_M_allocated_capacity)[-6],
                      (&paVar6->_M_allocated_capacity)[-4] + 1);
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar1) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  writeToFile(&local_280,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VulkanHppGenerator::generateRAIIHppFile() const
{
  std::string const vulkan_raii_hpp = std::string( BASE_PATH ) + "/vulkan/" + m_api + "_raii.hpp";
  messager.message( "VulkanHppGenerator: Generating " + vulkan_raii_hpp + " ...\n" );

  std::string str = replaceWithMap( readSnippet( "RAIIHppFileTemplate.hpp" ),
                                    { { "api", m_api },
                                      { "licenseHeader", m_vulkanLicenseHeader },
                                      { "RAIICommandDefinitions", generateRAIICommandDefinitions() },
                                      { "RAIIDispatchers", generateRAIIDispatchers() },
                                      { "RAIIHandles", generateRAIIHandles() } } );

  writeToFile( str, vulkan_raii_hpp );
}